

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetB.c
# Opt level: O3

void scalar_wnaf(int8_t *out,uchar *in)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  char cVar4;
  int iVar5;
  
  uVar2 = (uint)(*in & 0x3f);
  uVar3 = 0;
  do {
    bVar1 = (byte)uVar2;
    uVar2 = (int)(char)bVar1 & 1;
    cVar4 = (((bVar1 & 0x3f) < 0x20) << 6 | bVar1 & 0x3f) - 0x40;
    if (uVar2 == 0) {
      cVar4 = (char)uVar2;
    }
    out[uVar3] = cVar4;
    iVar5 = 0;
    if (uVar3 < 0x1fa) {
      iVar5 = (in[uVar3 + 6 >> 3 & 0x1fffffff] >> ((byte)(uVar3 + 6) & 7) & 1) << 5;
    }
    uVar3 = uVar3 + 1;
    uVar2 = ((uint)((int)(char)bVar1 - (int)cVar4) >> 1) + iVar5;
  } while (uVar3 != 0x201);
  return;
}

Assistant:

static void scalar_wnaf(int8_t out[513], const unsigned char in[64]) {
    int i;
    int8_t window, d;

    window = in[0] & (DRADIX_WNAF - 1);
    for (i = 0; i < 513; i++) {
        d = 0;
        if ((window & 1) && ((d = window & (DRADIX_WNAF - 1)) & DRADIX))
            d -= DRADIX_WNAF;
        out[i] = d;
        window = (window - d) >> 1;
        window += scalar_get_bit(in, i + 1 + RADIX) << RADIX;
    }
}